

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_int32(void)

{
  byte bVar1;
  int32_t iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int32_t *piVar5;
  bson_t *bcon;
  int32_t i32;
  
  uVar3 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(10);
  uVar3 = bcon_new(0,"foo",uVar3,0xf,iVar2);
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int32_ptr((int32_t *)((long)&bcon + 4));
  bVar1 = bcon_extract(uVar3,"foo",uVar4,0xf,piVar5,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xec,"test_int32","BCON_EXTRACT (bcon, \"foo\", BCONE_INT32 (i32))");
    abort();
  }
  if (bcon._4_4_ != 10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xee,"test_int32","i32 == 10");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_int32 (void)
{
   int32_t i32;

   bson_t *bcon = BCON_NEW ("foo", BCON_INT32 (10));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_INT32 (i32)));

   BSON_ASSERT (i32 == 10);

   bson_destroy (bcon);
}